

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# squall_defun.hpp
# Opt level: O0

SQInteger squall::detail::stub<2,std::function<void(std::shared_ptr<Foo>)>>(HSQUIRRELVM vm)

{
  SQUserPointer vm_00;
  int iVar1;
  SQRESULT SVar2;
  SQUserPointer *in_stack_fffffffffffffee0;
  SQUserPointer *in_stack_fffffffffffffee8;
  SQInteger in_stack_fffffffffffffef0;
  HSQUIRRELVM in_stack_fffffffffffffef8;
  exception *e;
  SQInteger x;
  function<void_(std::shared_ptr<Foo>)> *f;
  undefined8 *local_20;
  SQUserPointer fp;
  HSQUIRRELVM vm_local;
  
  fp = vm;
  SVar2 = sq_getuserdata(in_stack_fffffffffffffef8,in_stack_fffffffffffffef0,
                         in_stack_fffffffffffffee8,in_stack_fffffffffffffee0);
  vm_00 = fp;
  if (SVar2 < 0) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/KatuH[P]squall/samples/../squall/squall_defun.hpp"
                  ,0x42,
                  "SQInteger squall::detail::stub(HSQUIRRELVM) [Offset = 2, F = std::function<void (std::shared_ptr<Foo>)>]"
                 );
  }
  x = *local_20;
  std::function<void_(std::shared_ptr<Foo>)>::function
            ((function<void_(std::shared_ptr<Foo>)> *)&e,(function<void_(std::shared_ptr<Foo>)> *)x)
  ;
  iVar1 = Stub<void(std::shared_ptr<Foo>)>::doit<std::function<void(std::shared_ptr<Foo>)>>
                    ((HSQUIRRELVM)vm_00,2,(function<void_(std::shared_ptr<Foo>)> *)&e);
  std::function<void_(std::shared_ptr<Foo>)>::~function((function<void_(std::shared_ptr<Foo>)> *)&e)
  ;
  return (long)iVar1;
}

Assistant:

SQInteger stub(HSQUIRRELVM vm) {
    try {
        SQUserPointer fp;
        if(!SQ_SUCCEEDED(sq_getuserdata(vm, -1, &fp, NULL))) { assert(0); }
        const F& f = **((F**)fp);

        SQInteger x = Stub<typename detail::function_traits<F>::type>::doit(
            vm, Offset, f);
        return x;
    }
    catch(std::exception& e) {
        return sq_throwerror(
            vm, (string(_SC("error in callback: ")) + locale_converter::to_squall_string(e.what()).c_str()).c_str());
    }
}